

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void * lua_topointer(lua_State *L,int idx)

{
  TValue *pTVar1;
  GCObject *pGVar2;
  uint uVar3;
  
  pTVar1 = index2addr(L,idx);
  uVar3 = pTVar1->tt_ & 0x3f;
  pGVar2 = (GCObject *)0x0;
  switch(uVar3) {
  case 3:
  case 4:
    break;
  case 7:
    pGVar2 = (GCObject *)((pTVar1->value_).f + 0x28);
    break;
  default:
    if ((uVar3 != 0x16) && (uVar3 != 0x26)) {
      return (void *)0x0;
    }
  case 2:
  case 5:
  case 6:
  case 8:
    pGVar2 = (pTVar1->value_).gc;
  }
  return pGVar2;
}

Assistant:

LUA_API const void *lua_topointer(lua_State *L, int idx) {
    StkId o = index2addr(L, idx);
    switch (ttype(o)) {
        case LUA_TTABLE:
            return hvalue(o);
        case LUA_TLCL:
            return clLvalue(o);
        case LUA_TCCL:
            return clCvalue(o);
        case LUA_TLCF:
            return cast(void *, cast(size_t, fvalue(o)));
        case LUA_TTHREAD:
            return thvalue(o);
        case LUA_TUSERDATA:
            return getudatamem(uvalue(o));
        case LUA_TLIGHTUSERDATA:
            return pvalue(o);
        default:
            return NULL;
    }
}